

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool range_iterator(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  gravity_value_t value_03;
  gravity_value_t value_04;
  gravity_value_t value_05;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_1080;
  gravity_int_t n;
  char local_1068 [8];
  char _buffer [4096];
  gravity_value_t value;
  gravity_range_t *range;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = (args->field_1).p;
  if ((long)pgVar1->identifier < (long)pgVar1->objclass) {
    value_05.field_1.n = 0;
    value_05.isa = gravity_class_bool;
    gravity_vm_setslot(vm,value_05,rindex);
    vm_local._7_1_ = true;
  }
  else if ((args[1].isa == gravity_class_null) && (args[1].field_1.n == 0)) {
    value_04.field_1 =
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)pgVar1->objclass;
    value_04.isa = gravity_class_int;
    gravity_vm_setslot(vm,value_04,rindex);
    vm_local._7_1_ = true;
  }
  else if (args[1].isa == gravity_class_int) {
    if ((long)pgVar1->objclass < (long)pgVar1->identifier) {
      local_1080.p = (gravity_object_t *)((long)&(args[1].field_1.p)->isa + 1);
      if ((long)pgVar1->identifier < local_1080.n) {
        value_02.field_1.n = 0;
        value_02.isa = gravity_class_bool;
        gravity_vm_setslot(vm,value_02,rindex);
        return true;
      }
    }
    else {
      local_1080.p = (gravity_object_t *)((long)&args[1].field_1.p[-1].ivars + 7);
      if (local_1080.n < (long)pgVar1->identifier) {
        value_01.field_1.n = 0;
        value_01.isa = gravity_class_bool;
        gravity_vm_setslot(vm,value_01,rindex);
        return true;
      }
    }
    value_00.field_1.n = local_1080.n;
    value_00.isa = gravity_class_int;
    gravity_vm_setslot(vm,value_00,rindex);
    vm_local._7_1_ = true;
  }
  else {
    snprintf(local_1068,0x1000,"Iterator expects a numeric value here.");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1068);
    value_03.field_1.n = 0;
    value_03.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_03,rindex);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool range_iterator (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_range_t *range = VALUE_AS_RANGE(GET_VALUE(0));

    // check for invalid range first
    if (range->to < range->from) RETURN_VALUE(VALUE_FROM_FALSE, rindex);

    // check for start of iteration
    if (VALUE_ISA_NULL(GET_VALUE(1))) RETURN_VALUE(VALUE_FROM_INT(range->from), rindex);

    // extract value
    gravity_value_t value = GET_VALUE(1);

    // check error condition
    if (!VALUE_ISA_INT(value)) RETURN_ERROR("Iterator expects a numeric value here.");

    // compute new value
    gravity_int_t n = value.n;
    if (range->from < range->to) {
        ++n;
        if (n > range->to) RETURN_VALUE(VALUE_FROM_FALSE, rindex);
    } else {
        --n;
        if (n < range->to) RETURN_VALUE(VALUE_FROM_FALSE, rindex);
    }

    // return new iterator
    RETURN_VALUE(VALUE_FROM_INT(n), rindex);
}